

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestResult::Clear(TestResult *this)

{
  long in_RDI;
  
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::clear
            ((vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *)0x1437dc);
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::clear
            ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)0x1437ea);
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  return;
}

Assistant:

void TestResult::Clear() {
  test_part_results_.clear();
  test_properties_.clear();
  death_test_count_ = 0;
  elapsed_time_ = 0;
}